

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O0

void Mips_init(MCRegisterInfo *MRI)

{
  MCRegisterInfo *in_RDI;
  
  MCRegisterInfo_InitMCRegisterInfo
            (in_RDI,MipsRegDesc,0x18a,0,0,MipsMCRegisterClasses,0x3e,(uint16_t (*) [2])0x0,0,
             MipsRegDiffLists,(char *)0x0,MipsSubRegIdxLists,0xc,(uint16_t *)0x0);
  return;
}

Assistant:

void Mips_init(MCRegisterInfo *MRI)
{
	// InitMCRegisterInfo(MipsRegDesc, 394, RA, PC,
	// 		MipsMCRegisterClasses, 62,
	// 		MipsRegUnitRoots,
	// 		273,
	// 		MipsRegDiffLists,
	// 		MipsLaneMaskLists,
	// 		MipsRegStrings,
	// 		MipsRegClassStrings,
	// 		MipsSubRegIdxLists,
	// 		12,
	// 		MipsSubRegIdxRanges,
	// 		MipsRegEncodingTable);


	MCRegisterInfo_InitMCRegisterInfo(MRI, MipsRegDesc, 394,
			0, 0,
			MipsMCRegisterClasses, 62,
			0, 0,
			MipsRegDiffLists,
			0,
			MipsSubRegIdxLists, 12,
			0);
}